

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

bool __thiscall QSqlTableModel::selectRow(QSqlTableModel *this,int row)

{
  QString *this_00;
  undefined4 uVar1;
  long lVar2;
  QArrayData *pQVar3;
  undefined8 uVar4;
  QSqlTableModel *pQVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  uint uVar8;
  undefined8 uVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  QSqlDriver *pQVar16;
  ModifiedRow *pMVar17;
  Orientation row_00;
  QSqlRecord *this_01;
  long in_FS_OFFSET;
  QSqlRecord curValues;
  QSqlRecord newValues;
  QSqlQuery q;
  QSqlRecord moved;
  QExplicitlySharedDataPointer<QSqlRecordPrivate> local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  QSqlRecord local_c0;
  QString local_b8;
  QString local_98;
  uint local_7c;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_7c = row;
  if (-1 < row) {
    lVar2 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
    local_58._forAlignment = -NAN;
    local_58._8_8_ = 0;
    local_58._16_8_ = (QSqlTableModel *)0x0;
    iVar14 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x78))();
    if (row < iVar14) {
      uVar1 = *(undefined4 *)(lVar2 + 0x230);
      *(undefined4 *)(lVar2 + 0x230) = 0xffffffff;
      local_98.d.d = *(Data **)(lVar2 + 0x2b0);
      local_98.d.ptr = *(char16_t **)(lVar2 + 0x2b8);
      local_98.d.size = *(qsizetype *)(lVar2 + 0x2c0);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar16 = QSqlDatabase::driver((QSqlDatabase *)(lVar2 + 0x228));
      row_00 = (Orientation)this;
      primaryValues((QSqlTableModel *)&local_78,row_00);
      (**(code **)(*(long *)pQVar16 + 0xa8))(&local_58,pQVar16,0,lVar2 + 0x298,&local_78,0);
      pQVar3 = *(QArrayData **)(lVar2 + 0x2b0);
      uVar4 = *(undefined8 *)(lVar2 + 0x2b8);
      *(PrivateShared **)(lVar2 + 0x2b0) = local_58.shared;
      *(undefined8 *)(lVar2 + 0x2b8) = local_58._8_8_;
      pQVar5 = *(QSqlTableModel **)(lVar2 + 0x2c0);
      *(undefined8 *)(lVar2 + 0x2c0) = local_58._16_8_;
      local_58.shared = (PrivateShared *)pQVar3;
      local_58._8_8_ = uVar4;
      local_58._16_8_ = pQVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      this_00 = (QString *)(lVar2 + 0x2b0);
      QSqlRecord::~QSqlRecord((QSqlRecord *)&local_78.shared);
      if (selectRow(int)::wh == '\0') {
        selectRow();
      }
      cVar10 = QString::startsWith(this_00,0x151f20);
      if (cVar10 != '\0') {
        QString::remove((longlong)this_00,0);
      }
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char16_t *)0x0;
      local_b8.d.size = 0;
      if (*(long *)(lVar2 + 0x2c0) != 0) {
        (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1f8))(&local_58,this);
        uVar9 = local_58._16_8_;
        uVar4 = local_58.shared;
        pcVar7 = local_b8.d.ptr;
        pDVar6 = local_b8.d.d;
        local_58.shared = (PrivateShared *)local_b8.d.d;
        local_b8.d.d = (Data *)uVar4;
        local_b8.d.ptr = (char16_t *)local_58._8_8_;
        local_58._8_8_ = pcVar7;
        local_58._16_8_ = local_b8.d.size;
        local_b8.d.size = uVar9;
        if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
          }
        }
      }
      *(undefined4 *)(lVar2 + 0x230) = uVar1;
      QString::operator=(this_00,&local_98);
      if ((QSqlTableModel *)local_b8.d.size == (QSqlTableModel *)0x0) {
        bVar11 = false;
      }
      else {
        local_c0.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
        QSqlRecord::QSqlRecord(&local_c0);
        local_78.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
        QSqlQuery::QSqlQuery((QSqlQuery *)&local_78.shared,(QSqlDatabase *)(lVar2 + 0x228));
        QSqlQuery::setForwardOnly((QSqlQuery *)&local_78.shared,true);
        bVar11 = QSqlQuery::exec((QSqlQuery *)&local_78.shared,&local_b8);
        if (bVar11) {
          bVar12 = QSqlQuery::next((QSqlQuery *)&local_78.shared);
          QSqlQuery::record((QSqlQuery *)&local_d8);
          local_58.shared = (PrivateShared *)local_c0.d.d.ptr;
          local_c0.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)local_d8.d.ptr;
          local_d8.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_58.shared);
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_d8);
        }
        else {
          bVar12 = false;
        }
        QSqlQuery::~QSqlQuery((QSqlQuery *)&local_78.shared);
        if (bVar11) {
          bVar13 = true;
          if (bVar12 != false) {
            bVar13 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::contains
                               ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar2 + 0x2e0),
                                (int *)&local_7c);
          }
          if (bVar13 == false) {
            local_d8.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
            record((QSqlTableModel *)&local_d8,row_00);
            iVar14 = QSqlRecord::count((QSqlRecord *)&local_d8);
            iVar15 = QSqlRecord::count(&local_c0);
            bVar13 = iVar14 != iVar15;
            if (!bVar13) {
              iVar14 = QSqlRecord::count((QSqlRecord *)&local_d8);
              do {
                bVar13 = 0 < iVar14;
                if (iVar14 < 1) break;
                iVar14 = iVar14 + -1;
                QSqlRecord::value((QVariant *)&local_58,(QSqlRecord *)&local_d8,iVar14);
                QSqlRecord::value((QVariant *)&local_78,&local_c0,iVar14);
                cVar10 = QVariant::equals((QVariant *)&local_58);
                QVariant::~QVariant((QVariant *)&local_78);
                QVariant::~QVariant((QVariant *)&local_58);
              } while (cVar10 != '\0');
            }
            QSqlRecord::~QSqlRecord((QSqlRecord *)&local_d8);
          }
          if (bVar13 != false) {
            pMVar17 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                                ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar2 + 0x2e0),
                                 (int *)&local_7c);
            pMVar17->m_submitted = true;
            if (bVar12 == false) {
              pMVar17->m_op = Delete;
              QSqlRecord::clear(&pMVar17->m_rec);
              QSqlRecord::clear(&pMVar17->m_db_values);
            }
            else {
              pMVar17->m_op = Update;
              QSqlRecord::operator=(&pMVar17->m_db_values,&local_c0);
              this_01 = &pMVar17->m_rec;
              QSqlRecord::operator=(this_01,&local_c0);
              iVar14 = QSqlRecord::count(this_01);
              if (0 < iVar14) {
                iVar14 = iVar14 + 1;
                do {
                  QSqlRecord::setGenerated(this_01,iVar14 + -2,false);
                  iVar14 = iVar14 + -1;
                } while (1 < iVar14);
              }
            }
            QAbstractItemModel::headerDataChanged(row_00,2,local_7c);
            uVar8 = local_7c;
            local_58._4_4_ = 0;
            local_58._0_4_ = local_7c;
            local_58._8_8_ = 0;
            local_d8.d.ptr = (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xffffffffffffffff;
            local_d0 = 0;
            uStack_c8 = 0;
            local_58._16_8_ = this;
            iVar14 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x80))(this);
            local_78._4_4_ = iVar14 + -1;
            local_78._0_4_ = uVar8;
            local_78._8_8_ = 0;
            local_78._16_8_ = this;
            QAbstractItemModel::dataChanged
                      ((QModelIndex *)this,(QModelIndex *)&local_58,(QList *)local_78.data);
          }
        }
        QSqlRecord::~QSqlRecord(&local_c0);
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_0013a22e;
    }
  }
  bVar11 = false;
LAB_0013a22e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::selectRow(int row)
{
    Q_D(QSqlTableModel);

    if (row < 0 || row >= rowCount())
        return false;

    const int table_sort_col = d->sortColumn;
    d->sortColumn = -1;
    const QString table_filter = d->filter;
    d->filter = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement,
                                              d->tableName,
                                              primaryValues(row),
                                              false);
    static const QString wh = SqlTm::where() + SqlTm::sp();
    if (d->filter.startsWith(wh, Qt::CaseInsensitive))
        d->filter.remove(0, wh.size());

    QString stmt;

    if (!d->filter.isEmpty())
        stmt = selectStatement();

    d->sortColumn = table_sort_col;
    d->filter = table_filter;

    if (stmt.isEmpty())
        return false;

    bool exists;
    QSqlRecord newValues;

    {
        QSqlQuery q(d->db);
        q.setForwardOnly(true);
        if (!q.exec(stmt))
            return false;

        exists = q.next();
        newValues = q.record();
    }

    bool needsAddingToCache = !exists || d->cache.contains(row);

    if (!needsAddingToCache) {
        const QSqlRecord curValues = record(row);
        needsAddingToCache = curValues.count() != newValues.count();
        if (!needsAddingToCache) {
            // Look for changed values. Primary key fields are customarily first
            // and probably change less often than other fields, so start at the end.
            for (int f = curValues.count() - 1; f >= 0; --f) {
                if (curValues.value(f) != newValues.value(f)) {
                    needsAddingToCache = true;
                    break;
                }
            }
        }
    }

    if (needsAddingToCache) {
        d->cache[row].refresh(exists, newValues);
        emit headerDataChanged(Qt::Vertical, row, row);
        emit dataChanged(createIndex(row, 0), createIndex(row, columnCount() - 1));
    }

    return true;
}